

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aalcalc.cpp
# Opt level: O2

void __thiscall aalcalc::outputresultscsv_new(aalcalc *this)

{
  mapped_type *vec_aal;
  
  if (this->skipheader_ == false) {
    if (this->ord_output_ == true) {
      puts("SummaryId,SampleType,MeanLoss,SDLoss");
    }
    else if (this->parquet_output_ == false) {
      printf("summary_id,type,mean,standard_deviation");
      if ((this->sidxtoensemble_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          (this->sidxtoensemble_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start) {
        printf(",ensemble_id");
      }
      putchar(10);
    }
  }
  if ((this->parquet_output_ != true) || (this->ord_output_ != false)) {
    outputresultscsv_new<aal_rec>(this,&this->vec_analytical_aal_,1);
    vec_aal = std::
              map<int,_std::vector<aal_rec_period,_std::allocator<aal_rec_period>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aal_rec_period,_std::allocator<aal_rec_period>_>_>_>_>
              ::operator[](&this->vec_sample_aal_,&this->samplesize_);
    outputresultscsv_new<aal_rec_period>(this,vec_aal,this->samplesize_);
    if ((this->sidxtoensemble_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (this->sidxtoensemble_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start) {
      outputresultscsv_new(this,&this->vec_ensemble_aal_);
    }
    if (this->alct_output_ == true) {
      output_alct(this,&this->vec_sample_aal_);
      return;
    }
  }
  return;
}

Assistant:

void aalcalc::outputresultscsv_new()
{
	/* parquet_output_ | ord_output_ | output files
	 * ---------------------------------------------------
	 *        1        |      1      | ORD parquet and csv
	 *        1        |      0      | ORD parquet
	 *        0        |      1      | ORD csv
	 *        0        |      0      | legacy csv
	 */
	if (skipheader_ == false) {
		if (ord_output_ == true) {
			printf("SummaryId,SampleType,MeanLoss,SDLoss\n");
		} else if (parquet_output_ == false) {
			printf("summary_id,type,mean,standard_deviation");
			if (sidxtoensemble_.size() > 0) printf(",ensemble_id");
			printf("\n");
		}
	}

#ifdef HAVE_PARQUET
	// Write parquet file
	if (parquet_output_) {
		std::vector<OasisParquet::ParquetFields> parquetFields;
		parquetFields.push_back(
			{"SummaryId", parquet::Type::INT32,
			parquet::ConvertedType::INT_32});
		parquetFields.push_back(
			{"SampleType", parquet::Type::INT32,
			parquet::ConvertedType::INT_32});
		parquetFields.push_back(
			{"MeanLoss", parquet::Type::FLOAT,
			parquet::ConvertedType::NONE});
		parquetFields.push_back(
			{"SDLoss", parquet::Type::FLOAT,
			parquet::ConvertedType::NONE});

		parquet::StreamWriter os =
		  OasisParquet::SetupParquetOutputStream(parquet_outFile_,
							 parquetFields);

		outputresultsparquet(vec_analytical_aal_, 1, os);
		outputresultsparquet(vec_sample_aal_[samplesize_], samplesize_,
				     os);

		if (alct_output_) {
			std::vector<OasisParquet::ParquetFields> parquetFields_alct;
			parquetFields_alct.push_back(
				{"SummaryId", parquet::Type::INT32,
				parquet::ConvertedType::INT_32});
			parquetFields_alct.push_back(
				{"MeanLoss", parquet::Type::FLOAT,
				parquet::ConvertedType::NONE});
			parquetFields_alct.push_back(
				{"SDLoss", parquet::Type::FLOAT,
				parquet::ConvertedType::NONE});
			parquetFields_alct.push_back(
				{"SampleSize", parquet::Type::INT32,
				parquet::ConvertedType::INT_32});
			parquetFields_alct.push_back(
				{"LowerCI", parquet::Type::FLOAT,
				parquet::ConvertedType::NONE});
			parquetFields_alct.push_back(
				{"UpperCI", parquet::Type::FLOAT,
				parquet::ConvertedType::NONE});
			parquetFields_alct.push_back(
				{"StandardError", parquet::Type::FLOAT,
				parquet::ConvertedType::NONE});
			parquetFields_alct.push_back(
				{"RelativeError", parquet::Type::FLOAT,
				parquet::ConvertedType::NONE});
			parquetFields_alct.push_back(
				{"VarElementHaz", parquet::Type::FLOAT,
				parquet::ConvertedType::NONE});
			parquetFields_alct.push_back(
				{"StandardErrorHaz", parquet::Type::FLOAT,
				parquet::ConvertedType::NONE});
			parquetFields_alct.push_back(
				{"RelativeErrorHaz", parquet::Type::FLOAT,
				parquet::ConvertedType::NONE});
			parquetFields_alct.push_back(
				{"VarElementVuln", parquet::Type::FLOAT,
				parquet::ConvertedType::NONE});
			parquetFields_alct.push_back(
				{"StandardErrorVuln", parquet::Type::FLOAT,
				parquet::ConvertedType::NONE});
			parquetFields_alct.push_back(
				{"RelativeErrorVuln", parquet::Type::FLOAT,
				parquet::ConvertedType::NONE});
			// Ensure file has parquet extension to prevent conflict
			// with potential csv format output file
			std::string parquet_alct_outFile = alct_outFile_;
			if (parquet_alct_outFile.length() < 8 || parquet_alct_outFile.substr(parquet_alct_outFile.length() -8, 8) != ".parquet") {
				parquet_alct_outFile += ".parquet";
			}
			parquet::StreamWriter os_alct =
			  OasisParquet::SetupParquetOutputStream(parquet_alct_outFile,
								 parquetFields_alct);

			output_alct_parquet(vec_sample_aal_, os_alct);

		}
	}
#endif

	// Write csv file
	if (!(parquet_output_ == true && ord_output_ == false)) {
		outputresultscsv_new(vec_analytical_aal_, 1);
		outputresultscsv_new(vec_sample_aal_[samplesize_], samplesize_);

		if (sidxtoensemble_.size() > 0) {
			outputresultscsv_new(vec_ensemble_aal_);
		}

		if (alct_output_) output_alct(vec_sample_aal_);
	}

}